

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall flatbuffers::Parser::ParseMetaData(Parser *this,Definition *def)

{
  bool bVar1;
  Value *this_00;
  Value *e;
  undefined1 local_38 [8];
  string name;
  Definition *def_local;
  Parser *this_local;
  
  name.field_2._8_8_ = def;
  bVar1 = IsNext(this,0x28);
  if (bVar1) {
    do {
      std::__cxx11::string::string((string *)local_38,(string *)&this->attribute_);
      Expect(this,4);
      this_00 = (Value *)operator_new(0x40);
      Value::Value(this_00);
      SymbolTable<flatbuffers::Value>::Add
                ((SymbolTable<flatbuffers::Value> *)(name.field_2._8_8_ + 0x40),(string *)local_38,
                 this_00);
      bVar1 = IsNext(this,0x3a);
      if (bVar1) {
        ParseSingleValue(this,this_00);
      }
      bVar1 = IsNext(this,0x29);
      if (!bVar1) {
        Expect(this,0x2c);
      }
      std::__cxx11::string::~string((string *)local_38);
    } while (!bVar1);
  }
  return;
}

Assistant:

void Parser::ParseMetaData(Definition &def) {
  if (IsNext('(')) {
    for (;;) {
      auto name = attribute_;
      Expect(kTokenIdentifier);
      auto e = new Value();
      def.attributes.Add(name, e);
      if (IsNext(':')) {
        ParseSingleValue(*e);
      }
      if (IsNext(')')) break;
      Expect(',');
    }
  }
}